

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O1

void WebPRescalerExportRowExpand_C(WebPRescaler *wrk)

{
  uint8_t *puVar1;
  rescaler_t *prVar2;
  rescaler_t *prVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = wrk->num_channels * wrk->dst_width;
  puVar1 = wrk->dst;
  prVar2 = wrk->frow;
  if (wrk->y_accum == 0) {
    if (0 < (int)uVar6) {
      uVar8 = 0;
      do {
        iVar7 = (int)((ulong)wrk->fy_scale * (ulong)prVar2[uVar8] + 0x80000000 >> 0x20);
        if (0xff < iVar7) {
          iVar7 = 0xff;
        }
        puVar1[uVar8] = (uint8_t)iVar7;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)wrk->y_sub;
    if (0 < (int)uVar6) {
      prVar3 = wrk->irow;
      uVar5 = SUB164((ZEXT416((uint)-wrk->y_accum) << 0x20) / auVar4,0);
      uVar8 = 0;
      do {
        iVar9 = (int)((ulong)wrk->fy_scale *
                      ((ulong)prVar3[uVar8] * (ulong)uVar5 + (ulong)prVar2[uVar8] * (ulong)-uVar5 +
                       0x80000000 >> 0x20) + 0x80000000 >> 0x20);
        iVar7 = 0xff;
        if (iVar9 < 0x100) {
          iVar7 = iVar9;
        }
        puVar1[uVar8] = (uint8_t)iVar7;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
  }
  return;
}

Assistant:

void WebPRescalerExportRowExpand_C(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(wrk->y_expand);
  assert(wrk->y_sub != 0);
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint32_t J = frow[x_out];
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  } else {
    const uint32_t B = WEBP_RESCALER_FRAC(-wrk->y_accum, wrk->y_sub);
    const uint32_t A = (uint32_t)(WEBP_RESCALER_ONE - B);
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint64_t I = (uint64_t)A * frow[x_out]
                       + (uint64_t)B * irow[x_out];
      const uint32_t J = (uint32_t)((I + ROUNDER) >> WEBP_RESCALER_RFIX);
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  }
}